

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service_base::
async_send<asio::const_buffers_1,asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>>,asio::any_io_executor>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          const_buffers_1 *buffers,message_flags flags,
          write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>
          *handler,any_io_executor *io_ex)

{
  int iVar1;
  int iVar2;
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  *this_00;
  ptr local_50;
  any_io_executor *local_38;
  
  iVar1 = handler->start_;
  iVar2 = (handler->handler_).start_;
  local_50.h = handler;
  local_38 = io_ex;
  this_00 = reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
            ::ptr::allocate(handler);
  local_50.p = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
                *)0x0;
  local_50.v = this_00;
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  ::reactive_socket_send_op
            (this_00,&this->success_ec_,impl->socket_,impl->state_,buffers,flags,handler,local_38);
  local_50.p = this_00;
  start_op(this,impl,1,(reactor_op *)this_00,iVar2 == 0 || iVar1 == 0,true,
           (bool)((buffers->super_const_buffer).size_ == 0 & impl->state_ >> 4));
  local_50.v = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
                *)0x0;
  local_50.p = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
                *)0x0;
  reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
  ::ptr::~ptr(&local_50);
  return;
}

Assistant:

void async_send(base_implementation_type& impl,
      const ConstBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    typename associated_cancellation_slot<Handler>::type slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_send_op<
        ConstBufferSequence, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_,
        impl.state_, buffers, flags, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::write_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_send"));

    start_op(impl, reactor::write_op, p.p, is_continuation, true,
        ((impl.state_ & socket_ops::stream_oriented)
          && buffer_sequence_adapter<asio::const_buffer,
            ConstBufferSequence>::all_empty(buffers)));
    p.v = p.p = 0;
  }